

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegGetCounter(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegCounter *pxVar2;
  int newSize;
  xmlRegCounter *tmp;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (ctxt->maxCounters <= ctxt->nbCounters) {
    iVar1 = xmlGrowCapacity(ctxt->maxCounters,8,4,1000000000);
    if (iVar1 < 0) {
      xmlRegexpErrMemory(ctxt);
      return -1;
    }
    pxVar2 = (xmlRegCounter *)(*xmlRealloc)(ctxt->counters,(long)iVar1 << 3);
    if (pxVar2 == (xmlRegCounter *)0x0) {
      xmlRegexpErrMemory(ctxt);
      return -1;
    }
    ctxt->counters = pxVar2;
    ctxt->maxCounters = iVar1;
  }
  ctxt->counters[ctxt->nbCounters].min = -1;
  ctxt->counters[ctxt->nbCounters].max = -1;
  iVar1 = ctxt->nbCounters;
  ctxt->nbCounters = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlRegGetCounter(xmlRegParserCtxtPtr ctxt) {
    if (ctxt->nbCounters >= ctxt->maxCounters) {
	xmlRegCounter *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxCounters, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->counters, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->counters = tmp;
	ctxt->maxCounters = newSize;
    }
    ctxt->counters[ctxt->nbCounters].min = -1;
    ctxt->counters[ctxt->nbCounters].max = -1;
    return(ctxt->nbCounters++);
}